

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)0>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  ulong uVar1;
  ulong uVar2;
  Format FVar3;
  long lVar4;
  QList<unsigned_int> *pQVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [13];
  undefined1 auVar48 [15];
  unkuint9 Var49;
  undefined1 auVar50 [11];
  undefined1 auVar51 [13];
  undefined1 auVar52 [15];
  undefined1 auVar53 [11];
  undefined1 auVar54 [13];
  undefined1 auVar55 [15];
  undefined1 auVar56 [11];
  undefined1 auVar57 [15];
  undefined1 auVar58 [11];
  undefined1 auVar59 [13];
  undefined1 auVar60 [15];
  undefined1 auVar61 [11];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  ulong uVar74;
  uint uVar75;
  int iVar76;
  int len;
  ulong uVar77;
  uint *puVar78;
  uint uVar79;
  long in_FS_OFFSET;
  short sVar80;
  short sVar93;
  double dVar81;
  double dVar82;
  byte bVar94;
  undefined1 auVar83 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar84 [12];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double dVar95;
  double dVar96;
  undefined1 auVar97 [12];
  byte bVar105;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar106;
  short sVar108;
  undefined1 auVar107 [16];
  uint uVar109;
  double dVar110;
  uint uVar111;
  ushort uVar112;
  uint fdx;
  ushort uVar114;
  double dVar113;
  int iVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  int in_stack_ffffffffffffaed8;
  short local_50e8;
  short sStack_50e6;
  qreal local_50d8;
  qreal qStack_50d0;
  qreal fw;
  qreal fy;
  qreal fx;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  undefined1 auVar85 [16];
  undefined1 auVar101 [16];
  
  uVar74 = (ulong)(uint)length;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  image = &data->field_23;
  FVar3 = (data->field_23).texture.format;
  pQVar5 = (data->field_23).texture.colorTable;
  dVar95 = (double)x + 0.5;
  dVar113 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
    local_50d8 = data->m11;
    qStack_50d0 = data->m12;
    dVar116 = data->dx + dVar113 * data->m21 + dVar95 * local_50d8;
    dVar118 = data->dy + dVar113 * data->m22 + dVar95 * qStack_50d0;
  }
  else {
    local_50d8 = data->m11;
    qStack_50d0 = data->m12;
    dVar116 = data->dx + dVar113 * data->m21 + dVar95 * local_50d8;
    dVar118 = data->dy + dVar113 * data->m22 + dVar95 * qStack_50d0;
    dVar117 = dVar116 * 65536.0;
    dVar119 = dVar118 * 65536.0;
    dVar96 = dVar119;
    if (dVar117 <= dVar119) {
      dVar96 = dVar117;
    }
    dVar81 = trunc(local_50d8 * 65536.0);
    dVar82 = trunc(qStack_50d0 * 65536.0);
    dVar110 = (double)length * dVar81 + dVar117;
    dVar81 = (double)length * dVar82 + dVar119;
    dVar82 = dVar81;
    if (dVar110 <= dVar81) {
      dVar82 = dVar110;
    }
    if (dVar96 <= dVar82) {
      dVar82 = dVar96;
    }
    if (-2147483648.0 <= dVar82) {
      dVar96 = dVar119;
      if (dVar119 <= dVar117) {
        dVar96 = dVar117;
      }
      if (dVar81 <= dVar96) {
        dVar81 = dVar96;
      }
      if (dVar81 <= 2147483647.0) {
        fdx = (uint)(local_50d8 * 65536.0);
        iVar115 = (int)(qStack_50d0 * 65536.0);
        distxs._0_4_ = (int)dVar117 - 0x8000;
        uVar111 = (int)dVar119 - 0x8000;
        if (iVar115 != 0) {
          puVar78 = buffer;
          uVar109 = distxs._0_4_;
          if (length != 0) {
            do {
              iVar76 = (int)uVar74;
              uVar77 = 0x400;
              if (iVar76 < 0x400) {
                uVar77 = uVar74;
              }
              len = (int)uVar77;
              fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                        (buf1,buf2,len,&image->texture,uVar109,uVar111,fdx,iVar115);
              (*qPixelLayouts[FVar3].convertToARGB32PM)(buf1,len * 2,pQVar5);
              (*qPixelLayouts[FVar3].convertToARGB32PM)(buf2,len * 2,pQVar5);
              if (0 < iVar76) {
                uVar74 = 0;
                do {
                  uVar75 = uVar109 >> 8 & 0xff;
                  uVar1 = *(ulong *)(buf1 + uVar74 * 2);
                  uVar2 = *(ulong *)(buf2 + uVar74 * 2);
                  auVar8._8_6_ = 0;
                  auVar8._0_8_ = uVar1;
                  auVar8[0xe] = (char)(uVar1 >> 0x38);
                  auVar12._8_4_ = 0;
                  auVar12._0_8_ = uVar1;
                  auVar12[0xc] = (char)(uVar1 >> 0x30);
                  auVar12._13_2_ = auVar8._13_2_;
                  auVar16._8_4_ = 0;
                  auVar16._0_8_ = uVar1;
                  auVar16._12_3_ = auVar12._12_3_;
                  auVar20._8_2_ = 0;
                  auVar20._0_8_ = uVar1;
                  auVar20[10] = (char)(uVar1 >> 0x28);
                  auVar20._11_4_ = auVar16._11_4_;
                  auVar24._8_2_ = 0;
                  auVar24._0_8_ = uVar1;
                  auVar24._10_5_ = auVar20._10_5_;
                  auVar28[8] = (char)(uVar1 >> 0x20);
                  auVar28._0_8_ = uVar1;
                  auVar28._9_6_ = auVar24._9_6_;
                  auVar52._7_8_ = 0;
                  auVar52._0_7_ = auVar28._8_7_;
                  Var45 = CONCAT81(SUB158(auVar52 << 0x40,7),(char)(uVar1 >> 0x18));
                  auVar66._9_6_ = 0;
                  auVar66._0_9_ = Var45;
                  auVar53._1_10_ = SUB1510(auVar66 << 0x30,5);
                  auVar53[0] = (char)(uVar1 >> 0x10);
                  auVar67._11_4_ = 0;
                  auVar67._0_11_ = auVar53;
                  auVar54._1_12_ = SUB1512(auVar67 << 0x20,3);
                  auVar54[0] = (char)(uVar1 >> 8);
                  auVar6._8_6_ = 0;
                  auVar6._0_8_ = uVar2;
                  auVar6[0xe] = (char)(uVar2 >> 0x38);
                  auVar9._8_4_ = 0;
                  auVar9._0_8_ = uVar2;
                  auVar9[0xc] = (char)(uVar2 >> 0x30);
                  auVar9._13_2_ = auVar6._13_2_;
                  auVar13._8_4_ = 0;
                  auVar13._0_8_ = uVar2;
                  auVar13._12_3_ = auVar9._12_3_;
                  auVar17._8_2_ = 0;
                  auVar17._0_8_ = uVar2;
                  auVar17[10] = (char)(uVar2 >> 0x28);
                  auVar17._11_4_ = auVar13._11_4_;
                  auVar21._8_2_ = 0;
                  auVar21._0_8_ = uVar2;
                  auVar21._10_5_ = auVar17._10_5_;
                  auVar25[8] = (char)(uVar2 >> 0x20);
                  auVar25._0_8_ = uVar2;
                  auVar25._9_6_ = auVar21._9_6_;
                  auVar55._7_8_ = 0;
                  auVar55._0_7_ = auVar25._8_7_;
                  Var49 = CONCAT81(SUB158(auVar55 << 0x40,7),(char)(uVar2 >> 0x18));
                  auVar68._9_6_ = 0;
                  auVar68._0_9_ = Var49;
                  auVar56._1_10_ = SUB1510(auVar68 << 0x30,5);
                  auVar56[0] = (char)(uVar2 >> 0x10);
                  auVar69._11_4_ = 0;
                  auVar69._0_11_ = auVar56;
                  auVar30[2] = (char)(uVar2 >> 8);
                  auVar30._0_2_ = (ushort)uVar2;
                  auVar30._3_12_ = SUB1512(auVar69 << 0x20,3);
                  uVar79 = uVar111 >> 8 & 0xff;
                  auVar107 = pshuflw(ZEXT416(0x100 - uVar79),ZEXT416(0x100 - uVar79),0);
                  sVar106 = auVar107._0_2_;
                  sVar108 = auVar107._2_2_;
                  auVar107 = pshuflw(ZEXT416(uVar79),ZEXT416(uVar79),0);
                  sVar80 = auVar107._0_2_;
                  sVar93 = auVar107._2_2_;
                  auVar100._0_4_ =
                       CONCAT22(sVar93 * auVar30._2_2_ + sVar108 * auVar54._0_2_,
                                sVar80 * ((ushort)uVar2 & 0xff) + sVar106 * (ushort)(byte)uVar1);
                  auVar84._0_8_ =
                       CONCAT26(sVar93 * (short)Var49 + sVar108 * (short)Var45,
                                CONCAT24(sVar80 * auVar56._0_2_ + sVar106 * auVar53._0_2_,
                                         auVar100._0_4_));
                  auVar84._8_2_ = sVar80 * auVar25._8_2_ + sVar106 * auVar28._8_2_;
                  auVar84._10_2_ = sVar93 * auVar17._10_2_ + sVar108 * auVar20._10_2_;
                  auVar107._12_2_ = sVar80 * auVar9._12_2_ + sVar106 * auVar12._12_2_;
                  auVar107._0_12_ = auVar84;
                  auVar107._14_2_ = sVar93 * (auVar6._13_2_ >> 8) + sVar108 * (auVar8._13_2_ >> 8);
                  auVar99._0_4_ = CONCAT22((short)uVar75,(short)(0x100 - uVar75));
                  auVar99._4_4_ = auVar99._0_4_;
                  auVar99._8_4_ = auVar99._0_4_;
                  auVar99._12_4_ = auVar99._0_4_;
                  auVar100._12_4_ = auVar107._12_4_;
                  auVar100._4_4_ = auVar84._8_4_;
                  auVar100._8_4_ = (int)((ulong)auVar84._0_8_ >> 0x20);
                  auVar107 = pshuflw(auVar100,auVar100,0xd8);
                  auVar107 = pshufhw(auVar107,auVar107,0xd8);
                  auVar89._0_2_ = auVar107._0_2_ >> 8;
                  auVar89._2_2_ = auVar107._2_2_ >> 8;
                  auVar89._4_2_ = auVar107._4_2_ >> 8;
                  auVar89._6_2_ = auVar107._6_2_ >> 8;
                  auVar89._8_2_ = auVar107._8_2_ >> 8;
                  auVar89._10_2_ = auVar107._10_2_ >> 8;
                  auVar89._12_2_ = auVar107._12_2_ >> 8;
                  auVar89._14_2_ = auVar107._14_2_ >> 8;
                  auVar107 = pmaddwd(auVar89,auVar99);
                  auVar90._0_4_ = auVar107._0_4_ >> 8;
                  auVar90._4_4_ = auVar107._4_4_ >> 8;
                  auVar90._8_4_ = auVar107._8_4_ >> 8;
                  auVar90._12_4_ = auVar107._12_4_ >> 8;
                  auVar107 = packssdw(auVar90,auVar90);
                  sVar80 = auVar107._0_2_;
                  sVar93 = auVar107._2_2_;
                  sVar106 = auVar107._4_2_;
                  sVar108 = auVar107._6_2_;
                  puVar78[uVar74] =
                       CONCAT13((0 < sVar108) * (sVar108 < 0x100) * auVar107[6] - (0xff < sVar108),
                                CONCAT12((0 < sVar106) * (sVar106 < 0x100) * auVar107[4] -
                                         (0xff < sVar106),
                                         CONCAT11((0 < sVar93) * (sVar93 < 0x100) * auVar107[2] -
                                                  (0xff < sVar93),
                                                  (0 < sVar80) * (sVar80 < 0x100) * auVar107[0] -
                                                  (0xff < sVar80))));
                  uVar109 = uVar109 + fdx;
                  uVar111 = uVar111 + iVar115;
                  uVar74 = uVar74 + 1;
                } while (uVar77 != uVar74);
              }
              uVar74 = (ulong)(uint)(iVar76 - len);
              puVar78 = puVar78 + len;
            } while (iVar76 - len != 0);
          }
          goto LAB_00661199;
        }
        uVar109 = -fdx;
        if (0 < (int)fdx) {
          uVar109 = fdx;
        }
        puVar78 = buffer;
        if (0x10000 < uVar109) {
          if (0x20000 < uVar109) {
            if (length != 0) {
              auVar91._4_4_ = uVar111;
              auVar91._0_4_ = uVar111;
              auVar91._8_4_ = uVar111;
              auVar91._12_4_ = uVar111;
              auVar107 = ZEXT416(0x100 - (uVar111 >> 8 & 0xff));
              auVar100 = pshuflw(auVar107,auVar107,0);
              auVar107 = pshuflw(auVar91,auVar91,0);
              uVar112 = auVar107._0_2_;
              uVar114 = auVar107._2_2_;
              do {
                iVar115 = (int)uVar74;
                uVar77 = 0x400;
                if (iVar115 < 0x400) {
                  uVar77 = uVar74;
                }
                iVar76 = (int)uVar77;
                fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                          (buf1,buf2,iVar76,&image->texture,distxs._0_4_,uVar111,fdx,0);
                (*qPixelLayouts[FVar3].convertToARGB32PM)(buf1,iVar76 * 2,pQVar5);
                (*qPixelLayouts[FVar3].convertToARGB32PM)(buf2,iVar76 * 2,pQVar5);
                if (0 < iVar115) {
                  uVar74 = 0;
                  local_50e8 = auVar100._0_2_;
                  sStack_50e6 = auVar100._2_2_;
                  do {
                    uVar109 = (uint)distxs._0_4_ >> 8 & 0xff;
                    uVar1 = *(ulong *)(buf1 + uVar74 * 2);
                    uVar2 = *(ulong *)(buf2 + uVar74 * 2);
                    auVar10._8_6_ = 0;
                    auVar10._0_8_ = uVar1;
                    auVar10[0xe] = (char)(uVar1 >> 0x38);
                    auVar14._8_4_ = 0;
                    auVar14._0_8_ = uVar1;
                    auVar14[0xc] = (char)(uVar1 >> 0x30);
                    auVar14._13_2_ = auVar10._13_2_;
                    auVar18._8_4_ = 0;
                    auVar18._0_8_ = uVar1;
                    auVar18._12_3_ = auVar14._12_3_;
                    auVar22._8_2_ = 0;
                    auVar22._0_8_ = uVar1;
                    auVar22[10] = (char)(uVar1 >> 0x28);
                    auVar22._11_4_ = auVar18._11_4_;
                    auVar26._8_2_ = 0;
                    auVar26._0_8_ = uVar1;
                    auVar26._10_5_ = auVar22._10_5_;
                    auVar29[8] = (char)(uVar1 >> 0x20);
                    auVar29._0_8_ = uVar1;
                    auVar29._9_6_ = auVar26._9_6_;
                    auVar57._7_8_ = 0;
                    auVar57._0_7_ = auVar29._8_7_;
                    Var45 = CONCAT81(SUB158(auVar57 << 0x40,7),(char)(uVar1 >> 0x18));
                    auVar70._9_6_ = 0;
                    auVar70._0_9_ = Var45;
                    auVar58._1_10_ = SUB1510(auVar70 << 0x30,5);
                    auVar58[0] = (char)(uVar1 >> 0x10);
                    auVar71._11_4_ = 0;
                    auVar71._0_11_ = auVar58;
                    auVar59._1_12_ = SUB1512(auVar71 << 0x20,3);
                    auVar59[0] = (char)(uVar1 >> 8);
                    auVar7._8_6_ = 0;
                    auVar7._0_8_ = uVar2;
                    auVar7[0xe] = (char)(uVar2 >> 0x38);
                    auVar11._8_4_ = 0;
                    auVar11._0_8_ = uVar2;
                    auVar11[0xc] = (char)(uVar2 >> 0x30);
                    auVar11._13_2_ = auVar7._13_2_;
                    auVar15._8_4_ = 0;
                    auVar15._0_8_ = uVar2;
                    auVar15._12_3_ = auVar11._12_3_;
                    auVar19._8_2_ = 0;
                    auVar19._0_8_ = uVar2;
                    auVar19[10] = (char)(uVar2 >> 0x28);
                    auVar19._11_4_ = auVar15._11_4_;
                    auVar23._8_2_ = 0;
                    auVar23._0_8_ = uVar2;
                    auVar23._10_5_ = auVar19._10_5_;
                    auVar27[8] = (char)(uVar2 >> 0x20);
                    auVar27._0_8_ = uVar2;
                    auVar27._9_6_ = auVar23._9_6_;
                    auVar60._7_8_ = 0;
                    auVar60._0_7_ = auVar27._8_7_;
                    Var49 = CONCAT81(SUB158(auVar60 << 0x40,7),(char)(uVar2 >> 0x18));
                    auVar72._9_6_ = 0;
                    auVar72._0_9_ = Var49;
                    auVar61._1_10_ = SUB1510(auVar72 << 0x30,5);
                    auVar61[0] = (char)(uVar2 >> 0x10);
                    auVar73._11_4_ = 0;
                    auVar73._0_11_ = auVar61;
                    auVar31[2] = (char)(uVar2 >> 8);
                    auVar31._0_2_ = (ushort)uVar2;
                    auVar31._3_12_ = SUB1512(auVar73 << 0x20,3);
                    auVar102._0_4_ =
                         CONCAT22(auVar31._2_2_ * (uVar114 >> 8) + auVar59._0_2_ * sStack_50e6,
                                  ((ushort)uVar2 & 0xff) * (uVar112 >> 8) +
                                  (ushort)(byte)uVar1 * local_50e8);
                    auVar97._0_8_ =
                         CONCAT26((short)Var49 * (uVar114 >> 8) + (short)Var45 * sStack_50e6,
                                  CONCAT24(auVar61._0_2_ * (uVar112 >> 8) +
                                           auVar58._0_2_ * local_50e8,auVar102._0_4_));
                    auVar97._8_2_ = auVar27._8_2_ * (uVar112 >> 8) + auVar29._8_2_ * local_50e8;
                    auVar97._10_2_ = auVar19._10_2_ * (uVar114 >> 8) + auVar22._10_2_ * sStack_50e6;
                    auVar101._12_2_ = auVar11._12_2_ * (uVar112 >> 8) + auVar14._12_2_ * local_50e8;
                    auVar101._0_12_ = auVar97;
                    auVar101._14_2_ =
                         (auVar7._13_2_ >> 8) * (uVar114 >> 8) + (auVar10._13_2_ >> 8) * sStack_50e6
                    ;
                    auVar92._0_4_ = CONCAT22((short)uVar109,(short)(0x100 - uVar109));
                    auVar92._4_4_ = auVar92._0_4_;
                    auVar92._8_4_ = auVar92._0_4_;
                    auVar92._12_4_ = auVar92._0_4_;
                    auVar102._12_4_ = auVar101._12_4_;
                    auVar102._4_4_ = auVar97._8_4_;
                    auVar102._8_4_ = (int)((ulong)auVar97._0_8_ >> 0x20);
                    auVar107 = pshuflw(auVar102,auVar102,0xd8);
                    auVar107 = pshufhw(auVar107,auVar107,0xd8);
                    auVar103._0_2_ = auVar107._0_2_ >> 8;
                    auVar103._2_2_ = auVar107._2_2_ >> 8;
                    auVar103._4_2_ = auVar107._4_2_ >> 8;
                    auVar103._6_2_ = auVar107._6_2_ >> 8;
                    auVar103._8_2_ = auVar107._8_2_ >> 8;
                    auVar103._10_2_ = auVar107._10_2_ >> 8;
                    auVar103._12_2_ = auVar107._12_2_ >> 8;
                    auVar103._14_2_ = auVar107._14_2_ >> 8;
                    auVar107 = pmaddwd(auVar103,auVar92);
                    auVar104._0_4_ = auVar107._0_4_ >> 8;
                    auVar104._4_4_ = auVar107._4_4_ >> 8;
                    auVar104._8_4_ = auVar107._8_4_ >> 8;
                    auVar104._12_4_ = auVar107._12_4_ >> 8;
                    auVar107 = packssdw(auVar104,auVar104);
                    sVar80 = auVar107._0_2_;
                    sVar93 = auVar107._2_2_;
                    sVar106 = auVar107._4_2_;
                    sVar108 = auVar107._6_2_;
                    puVar78[uVar74] =
                         CONCAT13((0 < sVar108) * (sVar108 < 0x100) * auVar107[6] - (0xff < sVar108)
                                  ,CONCAT12((0 < sVar106) * (sVar106 < 0x100) * auVar107[4] -
                                            (0xff < sVar106),
                                            CONCAT11((0 < sVar93) * (sVar93 < 0x100) * auVar107[2] -
                                                     (0xff < sVar93),
                                                     (0 < sVar80) * (sVar80 < 0x100) * auVar107[0] -
                                                     (0xff < sVar80))));
                    distxs._0_4_ = distxs._0_4_ + fdx;
                    uVar74 = uVar74 + 1;
                  } while (uVar77 != uVar74);
                }
                puVar78 = puVar78 + iVar76;
                uVar74 = (ulong)(uint)(iVar115 - iVar76);
              } while (iVar115 - iVar76 != 0);
            }
            goto LAB_00661199;
          }
          uVar109 = length + 1U >> 1;
          if (length < 0x400) {
            uVar109 = length;
          }
          fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar109,&image->texture,(int *)distxs,
                     (int *)(ulong)uVar111,fdx,in_stack_ffffffffffffaed8);
          puVar78 = buffer + (int)uVar109;
          if (uVar109 == length) goto LAB_00661199;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (puVar78,buffer + length,&image->texture,(int *)distxs,(int *)(ulong)uVar111,fdx,
                   in_stack_ffffffffffffaed8);
        goto LAB_00661199;
      }
    }
  }
  dVar96 = data->m13;
  fw = dVar113 * data->m23 + dVar95 * dVar96 + data->m33;
  puVar78 = buffer;
  fy = dVar118;
  fx = dVar116;
  if (length != 0) {
    do {
      iVar115 = (int)uVar74;
      uVar77 = 0x400;
      if (iVar115 < 0x400) {
        uVar77 = uVar74;
      }
      iVar76 = (int)uVar77;
      fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                (buf1,buf2,distxs,distys,iVar76,&image->texture,&fx,&fy,&fw,local_50d8,qStack_50d0,
                 dVar96);
      (*qPixelLayouts[FVar3].convertToARGB32PM)(buf1,iVar76 * 2,pQVar5);
      (*qPixelLayouts[FVar3].convertToARGB32PM)(buf2,iVar76 * 2,pQVar5);
      if (0 < iVar115) {
        uVar74 = 0;
        do {
          uVar1 = *(ulong *)(buf1 + uVar74 * 2);
          uVar2 = *(ulong *)(buf2 + uVar74 * 2);
          bVar94 = (byte)(uVar1 >> 0x38);
          auVar33._8_6_ = 0;
          auVar33._0_8_ = uVar1;
          auVar33[0xe] = bVar94;
          auVar35._8_4_ = 0;
          auVar35._0_8_ = uVar1;
          auVar35[0xc] = (char)(uVar1 >> 0x30);
          auVar35._13_2_ = auVar33._13_2_;
          auVar37._8_4_ = 0;
          auVar37._0_8_ = uVar1;
          auVar37._12_3_ = auVar35._12_3_;
          auVar39._8_2_ = 0;
          auVar39._0_8_ = uVar1;
          auVar39[10] = (char)(uVar1 >> 0x28);
          auVar39._11_4_ = auVar37._11_4_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = uVar1;
          auVar41._10_5_ = auVar39._10_5_;
          auVar43[8] = (char)(uVar1 >> 0x20);
          auVar43._0_8_ = uVar1;
          auVar43._9_6_ = auVar41._9_6_;
          auVar44._7_8_ = 0;
          auVar44._0_7_ = auVar43._8_7_;
          Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar62._9_6_ = 0;
          auVar62._0_9_ = Var45;
          auVar46._1_10_ = SUB1510(auVar62 << 0x30,5);
          auVar46[0] = (char)(uVar1 >> 0x10);
          auVar63._11_4_ = 0;
          auVar63._0_11_ = auVar46;
          auVar47._1_12_ = SUB1512(auVar63 << 0x20,3);
          auVar47[0] = (char)(uVar1 >> 8);
          bVar105 = (byte)(uVar2 >> 0x38);
          auVar32._8_6_ = 0;
          auVar32._0_8_ = uVar2;
          auVar32[0xe] = bVar105;
          auVar34._8_4_ = 0;
          auVar34._0_8_ = uVar2;
          auVar34[0xc] = (char)(uVar2 >> 0x30);
          auVar34._13_2_ = auVar32._13_2_;
          auVar36._8_4_ = 0;
          auVar36._0_8_ = uVar2;
          auVar36._12_3_ = auVar34._12_3_;
          auVar38._8_2_ = 0;
          auVar38._0_8_ = uVar2;
          auVar38[10] = (char)(uVar2 >> 0x28);
          auVar38._11_4_ = auVar36._11_4_;
          auVar40._8_2_ = 0;
          auVar40._0_8_ = uVar2;
          auVar40._10_5_ = auVar38._10_5_;
          auVar42[8] = (char)(uVar2 >> 0x20);
          auVar42._0_8_ = uVar2;
          auVar42._9_6_ = auVar40._9_6_;
          auVar48._7_8_ = 0;
          auVar48._0_7_ = auVar42._8_7_;
          Var49 = CONCAT81(SUB158(auVar48 << 0x40,7),(char)(uVar2 >> 0x18));
          auVar64._9_6_ = 0;
          auVar64._0_9_ = Var49;
          auVar50._1_10_ = SUB1510(auVar64 << 0x30,5);
          auVar50[0] = (char)(uVar2 >> 0x10);
          auVar65._11_4_ = 0;
          auVar65._0_11_ = auVar50;
          auVar51._1_12_ = SUB1512(auVar65 << 0x20,3);
          auVar51[0] = (char)(uVar2 >> 8);
          uVar111 = (uint)*(byte *)((long)distys + uVar74 * 2 + 1);
          auVar107 = pshuflw(ZEXT416(0x100 - uVar111),ZEXT416(0x100 - uVar111),0);
          sVar106 = auVar107._0_2_;
          sVar108 = auVar107._2_2_;
          auVar107 = pshuflw(ZEXT416(uVar111),ZEXT416(uVar111),0);
          sVar80 = auVar107._0_2_;
          sVar93 = auVar107._2_2_;
          auVar86._0_4_ =
               CONCAT22(sVar93 * auVar51._0_2_ + sVar108 * auVar47._0_2_,
                        sVar80 * (ushort)(byte)uVar2 + sVar106 * (ushort)(byte)uVar1);
          auVar83._0_8_ =
               CONCAT26(sVar93 * (short)Var49 + sVar108 * (short)Var45,
                        CONCAT24(sVar80 * auVar50._0_2_ + sVar106 * auVar46._0_2_,auVar86._0_4_));
          auVar83._8_2_ = sVar80 * auVar42._8_2_ + sVar106 * auVar43._8_2_;
          auVar83._10_2_ = sVar93 * auVar38._10_2_ + sVar108 * auVar39._10_2_;
          auVar85._12_2_ = sVar80 * auVar34._12_2_ + sVar106 * auVar35._12_2_;
          auVar85._0_12_ = auVar83;
          auVar85._14_2_ = sVar93 * (ushort)bVar105 + sVar108 * (ushort)bVar94;
          auVar98._0_4_ = CONCAT22(distxs[uVar74] >> 8,0x100 - (distxs[uVar74] >> 8));
          auVar98._4_4_ = auVar98._0_4_;
          auVar98._8_4_ = auVar98._0_4_;
          auVar98._12_4_ = auVar98._0_4_;
          auVar86._12_4_ = auVar85._12_4_;
          auVar86._4_4_ = auVar83._8_4_;
          auVar86._8_4_ = (int)((ulong)auVar83._0_8_ >> 0x20);
          auVar107 = pshuflw(auVar86,auVar86,0xd8);
          auVar107 = pshufhw(auVar107,auVar107,0xd8);
          auVar87._0_2_ = auVar107._0_2_ >> 8;
          auVar87._2_2_ = auVar107._2_2_ >> 8;
          auVar87._4_2_ = auVar107._4_2_ >> 8;
          auVar87._6_2_ = auVar107._6_2_ >> 8;
          auVar87._8_2_ = auVar107._8_2_ >> 8;
          auVar87._10_2_ = auVar107._10_2_ >> 8;
          auVar87._12_2_ = auVar107._12_2_ >> 8;
          auVar87._14_2_ = auVar107._14_2_ >> 8;
          auVar107 = pmaddwd(auVar87,auVar98);
          auVar88._0_4_ = auVar107._0_4_ >> 8;
          auVar88._4_4_ = auVar107._4_4_ >> 8;
          auVar88._8_4_ = auVar107._8_4_ >> 8;
          auVar88._12_4_ = auVar107._12_4_ >> 8;
          auVar107 = packssdw(auVar88,auVar88);
          sVar80 = auVar107._0_2_;
          sVar93 = auVar107._2_2_;
          sVar106 = auVar107._4_2_;
          sVar108 = auVar107._6_2_;
          puVar78[uVar74] =
               CONCAT13((0 < sVar108) * (sVar108 < 0x100) * auVar107[6] - (0xff < sVar108),
                        CONCAT12((0 < sVar106) * (sVar106 < 0x100) * auVar107[4] - (0xff < sVar106),
                                 CONCAT11((0 < sVar93) * (sVar93 < 0x100) * auVar107[2] -
                                          (0xff < sVar93),
                                          (0 < sVar80) * (sVar80 < 0x100) * auVar107[0] -
                                          (0xff < sVar80))));
          uVar74 = uVar74 + 1;
        } while (uVar77 != uVar74);
      }
      uVar74 = (ulong)(uint)(iVar115 - iVar76);
      puVar78 = puVar78 + iVar76;
    } while (iVar115 - iVar76 != 0);
  }
LAB_00661199:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}